

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_regexp_get_source(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint32_t c;
  uint32_t c_00;
  ushort uVar11;
  int iVar12;
  JSObject *p;
  long *plVar13;
  uint uVar14;
  JSValue JVar15;
  StringBuffer b_s;
  StringBuffer local_50;
  
  if ((int)this_val.tag == -1) {
    BVar6 = js_same_value(ctx,this_val,ctx->class_proto[0x12]);
    if (BVar6 == 0) {
      if (*(short *)((long)this_val.u.ptr + 6) == 0x12) {
        plVar13 = (long *)((long)this_val.u.ptr + 0x30);
      }
      else {
        JS_ThrowTypeErrorInvalidClass(ctx,0x12);
        plVar13 = (long *)0x0;
      }
      if (plVar13 == (long *)0x0) goto LAB_001402c7;
      lVar2 = *plVar13;
      local_50.size = *(uint *)(lVar2 + 4) & 0x7fffffff;
      if (local_50.size == 0) goto LAB_001402f1;
      local_50.is_wide_char = *(uint *)(lVar2 + 4) >> 0x1f;
      local_50.len = 0;
      local_50.error_status = 0;
      local_50.ctx = ctx;
      local_50.str = js_alloc_string(ctx,local_50.size,local_50.is_wide_char);
      if (local_50.str == (JSString *)0x0) {
        local_50.size = 0;
        local_50.error_status = -1;
      }
      uVar14 = *(uint *)(lVar2 + 4) & 0x7fffffff;
      if (uVar14 != 0) {
        bVar3 = false;
        iVar12 = 0;
        do {
          lVar9 = (long)iVar12;
          iVar10 = (int)*(undefined8 *)(lVar2 + 4);
          if (iVar10 < 0) {
            c_00 = (uint32_t)*(ushort *)(lVar2 + 0x10 + lVar9 * 2);
          }
          else {
            c_00 = (uint32_t)*(byte *)(lVar2 + 0x10 + lVar9);
          }
          lVar1 = lVar9 + 1;
          c = 0xffffffff;
          iVar7 = (int)lVar1;
          if (0x5a < c_00) {
            if (c_00 == 0x5b) {
              c_00 = 0x5b;
              bVar4 = true;
              bVar5 = !bVar3;
              bVar3 = bVar4;
              if ((bVar5) && (iVar7 < (int)uVar14)) {
                if (iVar10 < 0) {
                  uVar11 = *(ushort *)(lVar2 + 0x12 + lVar9 * 2);
                }
                else {
                  uVar11 = (ushort)*(byte *)(lVar2 + 0x10 + lVar1);
                }
                if (uVar11 == 0x5d) goto LAB_00140457;
              }
            }
            else if (c_00 == 0x5d) {
              c_00 = 0x5d;
              bVar3 = false;
            }
            else if ((c_00 == 0x5c) && (c_00 = 0x5c, iVar7 < (int)uVar14)) {
LAB_00140457:
              iVar7 = iVar12 + 2;
              if (iVar10 < 0) {
                c = (uint32_t)*(ushort *)(lVar2 + 0x12 + lVar9 * 2);
              }
              else {
                c = (uint32_t)*(byte *)(lVar2 + 0x10 + lVar1);
              }
            }
            goto LAB_0014042b;
          }
          if (c_00 == 10) {
            c = 0x6e;
LAB_00140423:
            c_00 = 0x5c;
          }
          else {
            if (c_00 == 0xd) {
              c = 0x72;
              goto LAB_00140423;
            }
            if (c_00 == 0x2f) {
              if (!bVar3) {
                bVar3 = false;
                c = 0x2f;
                goto LAB_00140423;
              }
              c_00 = 0x2f;
              bVar3 = true;
            }
          }
LAB_0014042b:
          iVar12 = iVar7;
          string_buffer_putc16(&local_50,c_00);
          if (-1 < (int)c) {
            string_buffer_putc16(&local_50,c);
          }
        } while (iVar12 < (int)uVar14);
      }
      JVar15 = string_buffer_end(&local_50);
    }
    else {
LAB_001402f1:
      JVar15 = JS_NewStringLen(ctx,"(?:)",4);
    }
    uVar8 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
LAB_001402c7:
    JVar15 = (JSValue)(ZEXT816(6) << 0x40);
    uVar8 = 0;
  }
  JVar15.u.ptr = (void *)((ulong)JVar15.u.ptr & 0xffffffff | uVar8);
  return JVar15;
}

Assistant:

static JSValue js_regexp_get_source(JSContext *ctx, JSValueConst this_val)
{
    JSRegExp *re;
    JSString *p;
    StringBuffer b_s, *b = &b_s;
    int i, n, c, c2, bra;

    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    if (js_same_value(ctx, this_val, ctx->class_proto[JS_CLASS_REGEXP]))
        goto empty_regex;

    re = js_get_regexp(ctx, this_val, TRUE);
    if (!re)
        return JS_EXCEPTION;

    p = re->pattern;

    if (p->len == 0) {
    empty_regex:
        return JS_NewString(ctx, "(?:)");
    }    
    string_buffer_init2(ctx, b, p->len, p->is_wide_char);

    /* Escape '/' and newline sequences as needed */
    bra = 0;
    for (i = 0, n = p->len; i < n;) {
        c2 = -1;
        switch (c = string_get(p, i++)) {
        case '\\':
            if (i < n)
                c2 = string_get(p, i++);
            break;
        case ']':
            bra = 0;
            break;
        case '[':
            if (!bra) {
                if (i < n && string_get(p, i) == ']')
                    c2 = string_get(p, i++);
                bra = 1;
            }
            break;
        case '\n':
            c = '\\';
            c2 = 'n';
            break;
        case '\r':
            c = '\\';
            c2 = 'r';
            break;
        case '/':
            if (!bra) {
                c = '\\';
                c2 = '/';
            }
            break;
        }
        string_buffer_putc16(b, c);
        if (c2 >= 0)
            string_buffer_putc16(b, c2);
    }
    return string_buffer_end(b);
}